

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_dual_layers(Omega_h *this,Mesh *mesh,Read<signed_char> *marks,Int nlayers)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  Alloc *pAVar4;
  undefined8 uVar5;
  Alloc *pAVar6;
  Omega_h_Parting OVar7;
  ulong extraout_RDX;
  void *extraout_RDX_00;
  ulong uVar9;
  ulong extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  bool bVar10;
  Read<signed_char> RVar11;
  Graph dual;
  undefined1 local_a8 [32];
  Read<signed_char> local_88;
  Graph local_78;
  Alloc *local_58;
  Graph local_50;
  void *pvVar8;
  
  local_58 = (Alloc *)this;
  OVar7 = Mesh::parting(mesh);
  if (OVar7 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0xbf);
  }
  Mesh::ask_dual(&local_50,mesh);
  uVar9 = extraout_RDX;
  if (0 < nlayers) {
    do {
      local_78.a2ab.write_.shared_alloc_.alloc = local_50.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_50.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_78.a2ab.write_.shared_alloc_.alloc =
               (Alloc *)((local_50.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_50.a2ab.write_.shared_alloc_.alloc)->use_count =
               (local_50.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_78.a2ab.write_.shared_alloc_.direct_ptr = local_50.a2ab.write_.shared_alloc_.direct_ptr;
      local_78.ab2b.write_.shared_alloc_.alloc = local_50.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_50.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_78.ab2b.write_.shared_alloc_.alloc =
               (Alloc *)((local_50.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_50.ab2b.write_.shared_alloc_.alloc)->use_count =
               (local_50.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_78.ab2b.write_.shared_alloc_.direct_ptr = local_50.ab2b.write_.shared_alloc_.direct_ptr;
      local_88.write_.shared_alloc_.alloc = (marks->write_).shared_alloc_.alloc;
      if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
          local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_88.write_.shared_alloc_.alloc =
               (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_88.write_.shared_alloc_.alloc)->use_count =
               (local_88.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_88.write_.shared_alloc_.direct_ptr = (marks->write_).shared_alloc_.direct_ptr;
      graph_reduce<signed_char>((Omega_h *)local_a8,&local_78,&local_88,1,OMEGA_H_MAX);
      pAVar4 = (marks->write_).shared_alloc_.alloc;
      if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
        piVar1 = &pAVar4->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar4);
          operator_delete(pAVar4,0x48);
        }
      }
      pAVar4 = local_88.write_.shared_alloc_.alloc;
      (marks->write_).shared_alloc_.alloc = (Alloc *)local_a8._0_8_;
      (marks->write_).shared_alloc_.direct_ptr = (void *)local_a8._8_8_;
      if (((local_a8._0_8_ & 7) == 0 && (Alloc *)local_a8._0_8_ != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        *(int *)(local_a8._0_8_ + 0x30) = *(int *)(local_a8._0_8_ + 0x30) + -1;
        (marks->write_).shared_alloc_.alloc = (Alloc *)(*(size_t *)local_a8._0_8_ * 8 + 1);
      }
      local_a8._0_8_ = (Alloc *)0x0;
      local_a8._8_8_ = (element_type *)0x0;
      if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
          local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      pAVar4 = local_78.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_78.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_78.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_78.ab2b.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78.ab2b.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      pAVar4 = local_78.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_78.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_78.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_78.a2ab.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78.a2ab.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      uVar3 = mesh->dim_;
      if (3 < uVar3) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_a8._16_8_ = (marks->write_).shared_alloc_.alloc;
      if ((local_a8._16_8_ & 7) == 0 && (Alloc *)local_a8._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a8._16_8_ = ((Alloc *)local_a8._16_8_)->size * 8 + 1;
        }
        else {
          ((Alloc *)local_a8._16_8_)->use_count = ((Alloc *)local_a8._16_8_)->use_count + 1;
        }
      }
      local_a8._24_8_ = (marks->write_).shared_alloc_.direct_ptr;
      RVar11 = Mesh::sync_array<signed_char>
                         ((Mesh *)local_a8,(Int)mesh,(Read<signed_char> *)(ulong)uVar3,
                          (int)local_a8 + 0x10);
      pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
      pAVar4 = (marks->write_).shared_alloc_.alloc;
      if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
        piVar1 = &pAVar4->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar4);
          operator_delete(pAVar4,0x48);
          pvVar8 = extraout_RDX_00;
        }
      }
      uVar5 = local_a8._16_8_;
      (marks->write_).shared_alloc_.alloc = (Alloc *)local_a8._0_8_;
      (marks->write_).shared_alloc_.direct_ptr = (void *)local_a8._8_8_;
      uVar9 = (ulong)pvVar8 & 0xffffffffffffff00;
      if (((local_a8._0_8_ & 7) == 0 && (Alloc *)local_a8._0_8_ != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        *(int *)(local_a8._0_8_ + 0x30) = *(int *)(local_a8._0_8_ + 0x30) + -1;
        (marks->write_).shared_alloc_.alloc = (Alloc *)(*(size_t *)local_a8._0_8_ * 8 + 1);
      }
      local_a8._0_8_ = (Alloc *)0x0;
      local_a8._8_8_ = (element_type *)0x0;
      if ((local_a8._16_8_ & 7) == 0 && (Alloc *)local_a8._16_8_ != (Alloc *)0x0) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._16_8_ + 0x30);
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_a8._16_8_);
          operator_delete((void *)uVar5,0x48);
          uVar9 = extraout_RDX_01;
        }
      }
      nlayers = nlayers + -1;
    } while (nlayers != 0);
  }
  pAVar6 = local_58;
  pAVar4 = (marks->write_).shared_alloc_.alloc;
  local_58->size = (size_t)pAVar4;
  (local_58->name)._M_dataplus._M_p = (pointer)(marks->write_).shared_alloc_.direct_ptr;
  bVar10 = ((ulong)pAVar4 & 7) != 0;
  pvVar8 = (void *)CONCAT71((int7)(uVar9 >> 8),bVar10 || pAVar4 == (Alloc *)0x0);
  if ((!bVar10 && pAVar4 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    pAVar4->use_count = pAVar4->use_count + -1;
    local_58->size = pAVar4->size * 8 + 1;
  }
  (marks->write_).shared_alloc_.alloc = (Alloc *)0x0;
  (marks->write_).shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_50.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.ab2b.write_.shared_alloc_.alloc);
      operator_delete(local_50.ab2b.write_.shared_alloc_.alloc,0x48);
      pvVar8 = extraout_RDX_02;
    }
  }
  if (((ulong)local_50.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.a2ab.write_.shared_alloc_.alloc);
      operator_delete(local_50.a2ab.write_.shared_alloc_.alloc,0x48);
      pvVar8 = extraout_RDX_03;
    }
  }
  RVar11.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar11.write_.shared_alloc_.alloc = pAVar6;
  return (Read<signed_char>)RVar11.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_dual_layers(Mesh* mesh, Read<I8> marks, Int nlayers) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto dual = mesh->ask_dual();
  for (Int i = 0; i < nlayers; ++i) {
    marks = graph_reduce(dual, marks, 1, OMEGA_H_MAX);
    marks = mesh->sync_array(mesh->dim(), marks, 1);
  }
  return marks;
}